

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmTextureCalc.h
# Opt level: O0

uint64_t __thiscall
GmmLib::GmmTextureCalc::ScaleFCRectWidth
          (GmmTextureCalc *this,GMM_TEXTURE_INFO *pTexInfo,uint64_t Width)

{
  uint32_t TileYClearWidthScale;
  uint32_t FastClearRccTileYAlignWidth;
  uint32_t TileXClearWidthScale;
  uint32_t FastClearRccTileXAlignWidth;
  uint64_t ScaledWidth;
  uint64_t Width_local;
  GMM_TEXTURE_INFO *pTexInfo_local;
  GmmTextureCalc *this_local;
  
  if (pTexInfo == (GMM_TEXTURE_INFO *)0x0) {
    this_local = (GmmTextureCalc *)0x0;
  }
  else {
    if (pTexInfo->TileMode == LEGACY_TILE_X) {
      _TileXClearWidthScale =
           (GmmTextureCalc *)
           ((Width + ((int)(0x2000 / (ulong)pTexInfo->BitsPerPixel) - 1)) -
            (Width + ((int)(0x2000 / (ulong)pTexInfo->BitsPerPixel) - 1) &
            (ulong)((int)(0x2000 / (ulong)pTexInfo->BitsPerPixel) - 1)) >> 0xc);
    }
    else {
      _TileXClearWidthScale = (GmmTextureCalc *)Width;
      if (pTexInfo->TileMode == LEGACY_TILE_Y) {
        _TileXClearWidthScale =
             (GmmTextureCalc *)
             ((Width + ((int)(0x1000 / (ulong)pTexInfo->BitsPerPixel) - 1)) -
              (Width + ((int)(0x1000 / (ulong)pTexInfo->BitsPerPixel) - 1) &
              (ulong)((int)(0x1000 / (ulong)pTexInfo->BitsPerPixel) - 1)) >> 0xb);
      }
    }
    this_local = _TileXClearWidthScale;
  }
  return (uint64_t)this_local;
}

Assistant:

virtual uint64_t GMM_STDCALL ScaleFCRectWidth(GMM_TEXTURE_INFO * pTexInfo, uint64_t Width)
            {
                __GMM_ASSERTPTR(pTexInfo, 0);
                uint64_t ScaledWidth = Width;

                if (pTexInfo->TileMode == LEGACY_TILE_X)
                {
                    const uint32_t FastClearRccTileXAlignWidth = 8192; // bits - RCC ( Render Color Cache ) Alignment Sizes
                    const uint32_t TileXClearWidthScale = 4096;        // bits - Clear & Resolve Rect Scaling Sizes

                    ScaledWidth = GFX_ALIGN(ScaledWidth, FastClearRccTileXAlignWidth / pTexInfo->BitsPerPixel);
                    ScaledWidth /= TileXClearWidthScale;
                }
                else if (pTexInfo->TileMode == LEGACY_TILE_Y)
                {
                    const uint32_t FastClearRccTileYAlignWidth = 4096; // bits
                    const uint32_t TileYClearWidthScale = 2048;        // bits

                    ScaledWidth = GFX_ALIGN(ScaledWidth, FastClearRccTileYAlignWidth / pTexInfo->BitsPerPixel);
                    ScaledWidth /= TileYClearWidthScale;
                }
                return ScaledWidth;
            }